

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_glnodes.cpp
# Opt level: O3

bool DoLoadGLNodes(FileReader **lumps)

{
  undefined8 uVar1;
  ushort uVar2;
  FileReader *pFVar3;
  side_t *psVar4;
  seg_t *psVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  bool bVar11;
  uint uVar12;
  int *piVar13;
  long lVar14;
  ushort *puVar15;
  size_t __n;
  size_t sVar16;
  subsector_t *psVar17;
  long lVar18;
  sector_t_conflict *psVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  uint uVar24;
  mapsubsector_t *data;
  line_t_conflict *plVar25;
  long lVar26;
  vertex_t *pvVar27;
  ushort *puVar28;
  ulong uVar29;
  long lVar30;
  long local_40;
  
  pFVar3 = *lumps;
  firstglvertex = numvertexes;
  lVar14 = pFVar3->Length;
  uVar23 = (ulong)(int)lVar14;
  piVar13 = (int *)operator_new__(uVar23);
  (*(pFVar3->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar3,0,0);
  (*(pFVar3->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar3,piVar13,uVar23);
  pvVar27 = vertexes;
  iVar20 = *piVar13;
  if ((iVar20 != 0x35644e67) && (iVar20 != 0x32644e67)) {
    Printf("GL nodes v%d found. This format is not supported by ZDoom\n",
           (ulong)((uint)(iVar20 == 0x34644e67) * 3 + 1));
    operator_delete__(piVar13);
    return false;
  }
  format5 = iVar20 == 0x35644e67;
  iVar20 = (int)((ulong)((lVar14 << 0x20) + -0x400000000 >> 0x20) >> 3) + numvertexes;
  uVar23 = 0xffffffffffffffff;
  if (-1 < iVar20) {
    uVar23 = (long)iVar20 << 4;
  }
  numvertexes = iVar20;
  vertexes = (vertex_t *)operator_new__(uVar23);
  iVar10 = firstglvertex;
  lVar26 = (long)firstglvertex;
  memcpy(vertexes,pvVar27,lVar26 * 0x10);
  lVar14 = (long)numlines;
  if (0 < lVar14) {
    lVar18 = 0;
    do {
      *(long *)((long)lines->args + lVar18 + -0x2c) =
           (*(long *)((long)lines->args + lVar18 + -0x2c) - (long)pvVar27) + (long)vertexes;
      *(long *)((long)lines->args + lVar18 + -0x24) =
           (*(long *)((long)lines->args + lVar18 + -0x24) - (long)pvVar27) + (long)vertexes;
      lVar18 = lVar18 + 0x98;
    } while (lVar14 * 0x98 - lVar18 != 0);
  }
  if (iVar10 < iVar20) {
    pvVar27 = vertexes + lVar26;
    lVar14 = 0;
    do {
      uVar1 = *(undefined8 *)(piVar13 + lVar14 * 2 + 1);
      (pvVar27->p).X = (double)(int)uVar1 * 1.52587890625e-05;
      (pvVar27->p).Y = (double)(int)((ulong)uVar1 >> 0x20) * 1.52587890625e-05;
      lVar14 = lVar14 + 1;
      pvVar27 = pvVar27 + 1;
    } while (iVar20 - lVar26 != lVar14);
  }
  operator_delete__(piVar13);
  pFVar3 = lumps[1];
  numsegs = (int)pFVar3->Length;
  puVar15 = (ushort *)operator_new__((long)numsegs);
  (*(pFVar3->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar3,0,0);
  (*(pFVar3->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar3,puVar15,(long)numsegs);
  segs = (seg_t *)0x0;
  if (format5 == '\x01') {
    lVar14 = 0;
LAB_003fac33:
    iVar20 = numsegs >> 4;
    uVar29 = (ulong)iVar20;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar29;
    uVar23 = SUB168(auVar7 * ZEXT816(0x30),0);
    if (SUB168(auVar7 * ZEXT816(0x30),8) != 0) {
      uVar23 = 0xffffffffffffffff;
    }
    numsegs = iVar20;
    segs = (seg_t *)operator_new__(uVar23);
    uVar23 = uVar29 * 0x10;
    memset(segs,0,uVar29 * 0x30);
    if (iVar20 < 0) {
      uVar23 = 0xffffffffffffffff;
    }
    glsegextras = (glsegextra_t *)operator_new__(uVar23);
    iVar10 = firstglvertex;
    if (0 < iVar20) {
      lVar26 = 0;
      lVar18 = 0;
      lVar30 = 0;
      do {
        uVar12 = *(uint *)((long)puVar15 + lVar26 + lVar14);
        uVar24 = (uVar12 & 0x3fffffff) + iVar10;
        if (uVar12 < 0x40000000) {
          uVar24 = uVar12;
        }
        *(vertex_t **)((long)&segs->v1 + lVar18) = vertexes + (int)uVar24;
        uVar12 = *(uint *)((long)puVar15 + lVar26 + lVar14 + 4);
        uVar24 = (uVar12 & 0x3fffffff) + iVar10;
        if (uVar12 < 0x40000000) {
          uVar24 = uVar12;
        }
        *(vertex_t **)((long)&segs->v2 + lVar18) = vertexes + (int)uVar24;
        *(undefined4 *)((long)&glsegextras->PartnerSeg + lVar26) =
             *(undefined4 *)((long)puVar15 + lVar26 + lVar14 + 0xc);
        uVar23 = (ulong)*(ushort *)((long)puVar15 + lVar26 + lVar14 + 8);
        if (uVar23 == 0xffff) {
          *(undefined8 *)((long)&segs->linedef + lVar18) = 0;
          *(undefined8 *)((long)&segs->sidedef + lVar18) = 0;
          *(undefined8 *)((long)&segs->frontsector + lVar18) = 0;
          psVar19 = (sector_t_conflict *)0x0;
        }
        else {
          plVar25 = lines + uVar23;
          *(line_t_conflict **)((long)&segs->linedef + lVar18) = plVar25;
          uVar2 = *(ushort *)((long)puVar15 + lVar26 + lVar14 + 10);
          psVar4 = plVar25->sidedef[uVar2];
          *(side_t **)((long)&segs->sidedef + lVar18) = psVar4;
          if (psVar4 == (side_t *)0x0) {
            psVar19 = (sector_t_conflict *)0x0;
          }
          else {
            psVar19 = psVar4->sector;
          }
          *(sector_t_conflict **)((long)&segs->frontsector + lVar18) = psVar19;
          if (((plVar25->flags & 4) == 0) || (plVar25->sidedef[uVar2 ^ 1] == (side_t *)0x0)) {
            plVar25->flags = plVar25->flags & 0xfffffffb;
            psVar19 = (sector_t_conflict *)0x0;
          }
          else {
            psVar19 = plVar25->sidedef[uVar2 ^ 1]->sector;
          }
        }
        *(sector_t_conflict **)((long)&segs->backsector + lVar18) = psVar19;
        lVar30 = lVar30 + 1;
        lVar18 = lVar18 + 0x30;
        lVar26 = lVar26 + 0x10;
      } while (lVar30 < numsegs);
    }
  }
  else {
    if (*(int *)puVar15 == 0x33644e67) {
      numsegs = numsegs + -4;
      lVar14 = 4;
      goto LAB_003fac33;
    }
    iVar20 = (int)((ulong)(long)numsegs / 10);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (long)iVar20;
    __n = SUB168(auVar6 * ZEXT816(0x30),0);
    sVar16 = __n;
    if (SUB168(auVar6 * ZEXT816(0x30),8) != 0) {
      sVar16 = 0xffffffffffffffff;
    }
    numsegs = iVar20;
    segs = (seg_t *)operator_new__(sVar16);
    memset(segs,0,__n);
    uVar23 = (long)iVar20 << 4;
    if (iVar20 < 0) {
      uVar23 = 0xffffffffffffffff;
    }
    glsegextras = (glsegextra_t *)operator_new__(uVar23);
    iVar10 = firstglvertex;
    if (0 < iVar20) {
      lVar14 = 0;
      lVar26 = 0;
      lVar18 = 0;
      puVar28 = puVar15;
      do {
        uVar2 = *puVar28;
        uVar12 = (uVar2 & 0x7fff) + iVar10;
        if (-1 < (short)uVar2) {
          uVar12 = (uint)uVar2;
        }
        *(vertex_t **)((long)&segs->v1 + lVar26) = vertexes + (int)uVar12;
        uVar2 = puVar28[1];
        uVar12 = (uVar2 & 0x7fff) + iVar10;
        if (-1 < (short)uVar2) {
          uVar12 = (uint)uVar2;
        }
        *(vertex_t **)((long)&segs->v2 + lVar26) = vertexes + (int)uVar12;
        uVar12 = (uint)puVar28[4];
        if (uVar12 == 0xffff) {
          uVar12 = 0xffffffff;
        }
        *(uint *)((long)&glsegextras->PartnerSeg + lVar14) = uVar12;
        if ((ulong)puVar28[2] == 0xffff) {
          *(undefined8 *)((long)&segs->linedef + lVar26) = 0;
          *(undefined8 *)((long)&segs->sidedef + lVar26) = 0;
          *(undefined8 *)((long)&segs->frontsector + lVar26) = 0;
          psVar19 = (sector_t_conflict *)0x0;
        }
        else {
          plVar25 = lines + puVar28[2];
          *(line_t_conflict **)((long)&segs->linedef + lVar26) = plVar25;
          uVar2 = puVar28[3];
          psVar4 = plVar25->sidedef[uVar2];
          *(side_t **)((long)&segs->sidedef + lVar26) = psVar4;
          if (psVar4 == (side_t *)0x0) {
            psVar19 = (sector_t_conflict *)0x0;
          }
          else {
            psVar19 = psVar4->sector;
          }
          *(sector_t_conflict **)((long)&segs->frontsector + lVar26) = psVar19;
          if (((plVar25->flags & 4) == 0) || (plVar25->sidedef[uVar2 ^ 1] == (side_t *)0x0)) {
            plVar25->flags = plVar25->flags & 0xfffffffb;
            psVar19 = (sector_t_conflict *)0x0;
          }
          else {
            psVar19 = plVar25->sidedef[uVar2 ^ 1]->sector;
          }
        }
        *(sector_t_conflict **)((long)&segs->backsector + lVar26) = psVar19;
        lVar18 = lVar18 + 1;
        lVar26 = lVar26 + 0x30;
        lVar14 = lVar14 + 0x10;
        puVar28 = puVar28 + 5;
      } while (lVar18 < numsegs);
    }
  }
  operator_delete__(puVar15);
  pFVar3 = lumps[2];
  numsubsectors = (int)pFVar3->Length;
  piVar13 = (int *)operator_new__((long)numsubsectors);
  (*(pFVar3->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar3,0,0);
  (*(pFVar3->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar3,piVar13,(long)numsubsectors);
  if (numsubsectors == 0) {
LAB_003fb076:
    operator_delete__(piVar13);
    goto LAB_003fb0a2;
  }
  if (format5 == '\0') {
    if (*piVar13 == 0x33644e67) {
      local_40 = 4;
      goto LAB_003faeef;
    }
    iVar20 = numsubsectors >> 2;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = (long)iVar20;
    sVar16 = SUB168(auVar8 * ZEXT816(0x30),0);
    uVar23 = 0xffffffffffffffff;
    if (SUB168(auVar8 * ZEXT816(0x30),8) == 0) {
      uVar23 = sVar16;
    }
    numsubsectors = iVar20;
    psVar17 = (subsector_t *)operator_new__(uVar23);
    subsectors = psVar17;
    memset(psVar17,0,sVar16);
    if (0 < iVar20) {
      lVar14 = 0x28;
      lVar26 = 0;
      do {
        *(uint *)((long)&psVar17->sector + lVar14) = (uint)*(ushort *)(piVar13 + lVar26);
        *(ulong *)((long)psVar17 + lVar14 + -0x10) =
             (long)&segs->v1 + (ulong)((uint)*(ushort *)((long)piVar13 + lVar26 * 4 + 2) * 0x30);
        if (*(int *)((long)&subsectors->sector + lVar14) == 0) goto LAB_003fb076;
        lVar26 = lVar26 + 1;
        lVar14 = lVar14 + 0x30;
        psVar17 = subsectors;
      } while (lVar26 < numsubsectors);
      goto LAB_003faf8c;
    }
  }
  else {
    local_40 = 0;
LAB_003faeef:
    iVar20 = numsubsectors >> 3;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = (long)iVar20;
    uVar23 = 0xffffffffffffffff;
    if (SUB168(auVar9 * ZEXT816(0x30),8) == 0) {
      uVar23 = SUB168(auVar9 * ZEXT816(0x30),0);
    }
    numsubsectors = iVar20;
    psVar17 = (subsector_t *)operator_new__(uVar23);
    subsectors = psVar17;
    memset(psVar17,0,(long)iVar20 * 0x30);
    if (0 < iVar20) {
      lVar14 = 0x28;
      lVar26 = 0;
      do {
        *(undefined4 *)((long)&psVar17->sector + lVar14) =
             *(undefined4 *)((long)piVar13 + lVar26 * 8 + local_40);
        *(seg_t **)((long)psVar17 + lVar14 + -0x10) =
             segs + *(int *)((long)piVar13 + lVar26 * 8 + local_40 + 4);
        if (*(int *)((long)&subsectors->sector + lVar14) == 0) goto LAB_003fb076;
        lVar26 = lVar26 + 1;
        lVar14 = lVar14 + 0x30;
        psVar17 = subsectors;
      } while (lVar26 < numsubsectors);
LAB_003faf8c:
      if (0 < numsubsectors) {
        uVar23 = (ulong)(uint)numsubsectors;
        uVar29 = 0;
        psVar17 = subsectors;
        do {
          if (psVar17[uVar29].numlines == 0) {
            uVar22 = 0;
          }
          else {
            lVar14 = 0x28;
            uVar21 = 0;
            do {
              psVar5 = psVar17[uVar29].firstline;
              if (*(long *)((long)psVar5 + lVar14 + -0x10) == 0) {
                psVar19 = psVar5->frontsector;
                *(sector_t_conflict **)((long)&psVar5->v1 + lVar14) = psVar19;
                *(sector_t_conflict **)((long)psVar5 + lVar14 + -8) = psVar19;
                psVar17 = subsectors;
              }
              uVar21 = uVar21 + 1;
              uVar22 = (ulong)psVar17[uVar29].numlines;
              lVar14 = lVar14 + 0x30;
            } while (uVar21 < uVar22);
          }
          if (psVar17[uVar29].firstline[uVar22 - 1].v2 != (psVar17[uVar29].firstline)->v1)
          goto LAB_003fb076;
          uVar29 = uVar29 + 1;
        } while (uVar29 != uVar23);
      }
    }
  }
  operator_delete__(piVar13);
  bVar11 = LoadNodes(lumps[3]);
  if (bVar11) {
    if (0 < (long)numsubsectors) {
      lVar14 = 0;
      do {
        if (*(long *)(*(long *)((long)&subsectors->firstline + lVar14) + 0x10) == 0) {
          Printf("GL nodes contain invalid data. The BSP has to be rebuilt.\n");
          if (nodes != (node_t *)0x0) {
            operator_delete__(nodes);
          }
          nodes = (node_t *)0x0;
          goto LAB_003fb0a2;
        }
        lVar14 = lVar14 + 0x30;
      } while ((long)numsubsectors * 0x30 != lVar14);
    }
    uVar12 = CheckForMissingSegs();
    if (0 < (int)uVar12) {
      Printf("%d missing segs counted in GL nodes.\nThe BSP has to be rebuilt.\n",(ulong)uVar12);
    }
    return uVar12 == 0;
  }
  if (nodes != (node_t *)0x0) {
    operator_delete__(nodes);
  }
  nodes = (node_t *)0x0;
LAB_003fb0a2:
  if (subsectors != (subsector_t *)0x0) {
    operator_delete__(subsectors);
  }
  subsectors = (subsector_t *)0x0;
  if (segs != (seg_t *)0x0) {
    operator_delete__(segs);
  }
  segs = (seg_t *)0x0;
  return false;
}

Assistant:

static bool DoLoadGLNodes(FileReader ** lumps)
{
	if (!LoadGLVertexes(lumps[0]))
	{
		return false;
	}
	if (!LoadGLSegs(lumps[1]))
	{
		delete [] segs;
		segs = NULL;
		return false;
	}
	if (!LoadGLSubsectors(lumps[2]))
	{
		delete [] subsectors;
		subsectors = NULL;
		delete [] segs;
		segs = NULL;
		return false;
	}
	if (!LoadNodes(lumps[3]))
	{
		delete [] nodes;
		nodes = NULL;
		delete [] subsectors;
		subsectors = NULL;
		delete [] segs;
		segs = NULL;
		return false;
	}

	// Quick check for the validity of the nodes
	// For invalid nodes there is a high chance that this test will fail

	for (int i = 0; i < numsubsectors; i++)
	{
		seg_t * seg = subsectors[i].firstline;
		if (!seg->sidedef) 
		{
			Printf("GL nodes contain invalid data. The BSP has to be rebuilt.\n");
			delete [] nodes;
			nodes = NULL;
			delete [] subsectors;
			subsectors = NULL;
			delete [] segs;
			segs = NULL;
			return false;
		}
	}

	// check whether the BSP covers all sidedefs completely.
	int missing = CheckForMissingSegs();
	if (missing > 0)
	{
		Printf("%d missing segs counted in GL nodes.\nThe BSP has to be rebuilt.\n", missing);
	}
	return missing == 0;
}